

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

AST_Translation_Unit * get_translation_unit_tree(void)

{
  AST_Translation_Unit *pAVar1;
  Linkage *pLVar2;
  Scope *pSVar3;
  
  pAVar1 = (AST_Translation_Unit *)malloc(0x48);
  pLVar2 = get_linkage();
  pAVar1->internal_linkage = pLVar2;
  pSVar3 = get_normal_scope((Scope *)0x0,FILE_SCOPE);
  pAVar1->file_scope = pSVar3;
  Queue_Init(&pAVar1->components);
  Queue_Init(&pAVar1->static_objects);
  pAVar1->type = TRANSLATION_UNIT;
  return pAVar1;
}

Assistant:

struct AST_Translation_Unit* get_translation_unit_tree()
{
	struct AST_Translation_Unit *ret;
	ret=malloc(sizeof(struct AST_Translation_Unit));

	ret->internal_linkage=get_linkage();
	ret->file_scope=get_normal_scope(NULL,FILE_SCOPE);



	Queue_Init(&ret->components);
	Queue_Init(&ret->static_objects);
	ret->type=TRANSLATION_UNIT;

	return ret;
}